

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info.hpp
# Opt level: O0

string * __thiscall chaiscript::Type_Info::bare_name_abi_cxx11_(Type_Info *this)

{
  char *pcVar1;
  long in_RSI;
  string *in_RDI;
  allocator local_25 [20];
  allocator local_11 [17];
  
  if (*(long *)(in_RSI + 8) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else {
    pcVar1 = std::type_info::name(*(type_info **)(in_RSI + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  return in_RDI;
}

Assistant:

std::string bare_name() const
      {
        if (m_bare_type_info)
        {
          return m_bare_type_info->name();
        } else {
          return "";
        }
      }